

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O2

string * __thiscall
symbols::BoolObject::toString_abi_cxx11_(string *__return_storage_ptr__,BoolObject *this)

{
  allocator<char> *__a;
  char *__s;
  allocator<char> local_a;
  allocator<char> local_9;
  
  if ((this->super_Object).field_0xc == '\x01') {
    __s = "true";
    __a = &local_9;
  }
  else {
    __s = "false";
    __a = &local_a;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string BoolObject::toString() const
{
    if(value)
        return "true";
    return "false";

}